

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall btGeneric6DofConstraint::calculateAngleInfo(btGeneric6DofConstraint *this)

{
  long in_RDI;
  btTransform *this_00;
  btTransform *this_01;
  btVector3 bVar1;
  btVector3 axis2;
  btVector3 axis0;
  btMatrix3x3 relative_frame;
  btVector3 *this_02;
  btVector3 *in_stack_ffffffffffffff30;
  btMatrix3x3 *in_stack_ffffffffffffff38;
  btMatrix3x3 *in_stack_ffffffffffffff80;
  btMatrix3x3 *in_stack_ffffffffffffffa8;
  btMatrix3x3 *in_stack_ffffffffffffffb0;
  btVector3 local_38 [3];
  
  this_00 = (btTransform *)(in_RDI + 0x440);
  btTransform::getBasis(this_00);
  btMatrix3x3::inverse(in_stack_ffffffffffffff80);
  this_01 = (btTransform *)(in_RDI + 0x480);
  btTransform::getBasis(this_01);
  this_02 = local_38;
  ::operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  matrixToEulerXYZ(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  btTransform::getBasis(this_01);
  btMatrix3x3::getColumn(&this_00->m_basis,(int)((ulong)this_01 >> 0x20));
  btTransform::getBasis(this_00);
  btMatrix3x3::getColumn(&this_00->m_basis,(int)((ulong)this_01 >> 0x20));
  bVar1 = btVector3::cross((btVector3 *)this_00,(btVector3 *)this_01);
  *(long *)(in_RDI + 0x4e0) = bVar1.m_floats._0_8_;
  *(long *)(in_RDI + 0x4e8) = bVar1.m_floats._8_8_;
  bVar1 = btVector3::cross((btVector3 *)this_00,(btVector3 *)this_01);
  *(long *)(in_RDI + 0x4d0) = bVar1.m_floats._0_8_;
  *(long *)(in_RDI + 0x4d8) = bVar1.m_floats._8_8_;
  bVar1 = btVector3::cross((btVector3 *)this_00,(btVector3 *)this_01);
  *(long *)(in_RDI + 0x4f0) = bVar1.m_floats._0_8_;
  *(long *)(in_RDI + 0x4f8) = bVar1.m_floats._8_8_;
  btVector3::normalize(this_02);
  btVector3::normalize(this_02);
  btVector3::normalize(this_02);
  return;
}

Assistant:

void btGeneric6DofConstraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff);
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
	btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);

	m_calculatedAxis[1] = axis2.cross(axis0);
	m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
	m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}